

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O1

void lest::report(ostream *os,message *e,string *test)

{
  pointer pcVar1;
  ostream *poVar2;
  char *__s;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char *local_50;
  long local_48;
  char local_40 [16];
  int local_30;
  
  pcVar1 = (e->where).file._M_dataplus._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (e->where).file._M_string_length);
  local_30 = (e->where).line;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(e->kind)._M_dataplus._M_p,(e->kind)._M_string_length);
  pcVar1 = (e->note).info._M_dataplus._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + (e->note).info._M_string_length);
  if (local_90._M_string_length == 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
  }
  else {
    std::operator+(&local_70," ",&local_90);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_70._M_dataplus._M_p,local_70._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(test->_M_dataplus)._M_p,test->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  __s = (char *)(**(code **)(*(long *)e + 0x10))(e);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

inline void report( std::ostream & os, message const & e, std::string test )
{
    os << e.where << ": " << e.kind << e.note << ": " << test << ": " << e.what() << std::endl;
}